

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroller.cpp
# Opt level: O0

int __thiscall QtMWidgets::ScrollerPrivate::init(ScrollerPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint *puVar2;
  QVariantAnimation *this_00;
  int local_1c;
  int local_18;
  uint local_14;
  ScrollerPrivate *pSStack_10;
  int finger;
  ScrollerPrivate *this_local;
  
  pSStack_10 = this;
  local_18 = FingerGeometry::height();
  local_1c = FingerGeometry::width();
  puVar2 = (uint *)qMax<int>(&local_18,&local_1c);
  local_14 = *puVar2;
  this->minVelocity = local_14 * 3;
  this->maxVelocity = local_14 * 2;
  this->startDragDistance = local_14;
  QObject::installEventFilter(this->target);
  this_00 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(this_00,&this->q->super_QObject);
  this->scrollAnimation = this_00;
  QVariantAnimation::setEasingCurve((QEasingCurve *)this->scrollAnimation);
  iVar1 = QVariantAnimation::setDuration((int)this->scrollAnimation);
  return iVar1;
}

Assistant:

void
ScrollerPrivate::init()
{
	const int finger = qMax( FingerGeometry::height(), FingerGeometry::width() );

	minVelocity = finger * 3;
	maxVelocity = finger * 2;
	startDragDistance = finger;

	target->installEventFilter( q );

	scrollAnimation = new QVariantAnimation( q );
	scrollAnimation->setEasingCurve( scrollingCurve );
	scrollAnimation->setDuration( scrollTime );
}